

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_handshake_flow(quicly_conn_t *conn,size_t epoch,quicly_send_context_t *s,int ack_only,
                       int send_probe)

{
  undefined1 *puVar1;
  st_quicly_pn_space_t *psVar2;
  int in_ECX;
  st_quicly_pn_space_t *in_RDX;
  quicly_conn_t *in_RSI;
  quicly_send_context_t *in_RDI;
  int in_R8D;
  quicly_stream_t *stream;
  int ret;
  st_quicly_pn_space_t *space;
  quicly_send_context_t *in_stack_00000040;
  quicly_stream_t *in_stack_00000048;
  quicly_stream_t *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  int iVar3;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar3 = 0;
  psVar2 = setup_send_space((quicly_conn_t *)CONCAT44(in_ECX,in_R8D),in_stack_ffffffffffffffd0,
                            (quicly_send_context_t *)(ulong)in_stack_ffffffffffffffc8);
  if (psVar2 == (st_quicly_pn_space_t *)0x0) {
    iVar3 = 0;
  }
  else if (((psVar2 == (st_quicly_pn_space_t *)0x0) ||
           (((psVar2->unacked_count == 0 && (in_R8D == 0)) ||
            (iVar3 = send_ack(in_RSI,in_RDX,(quicly_send_context_t *)CONCAT44(in_ECX,in_R8D)),
            iVar3 == 0)))) && (in_ECX == 0)) {
    while (((uint)*(byte *)((long)&in_RDI[0x11].payload_buf.end + 4) &
           1 << ((byte)in_RSI & 0x1f) & 0xffU) != 0) {
      in_stack_ffffffffffffffc0 =
           quicly_get_stream((quicly_conn_t *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                             (quicly_stream_id_t)in_stack_ffffffffffffffc0);
      if (in_stack_ffffffffffffffc0 == (quicly_stream_t *)0x0) {
        __assert_fail("stream != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0xf92,
                      "int send_handshake_flow(quicly_conn_t *, size_t, quicly_send_context_t *, int, int)"
                     );
      }
      iVar3 = quicly_send_stream(in_stack_00000048,in_stack_00000040);
      if (iVar3 != 0) {
        return iVar3;
      }
      resched_stream_data(in_stack_ffffffffffffffc0);
      in_R8D = 0;
    }
    if ((in_R8D != 0) &&
       (iVar3 = _do_allocate_frame((quicly_conn_t *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   in_RDI,(size_t)in_RSI,(int)((ulong)in_RDX >> 0x20)), iVar3 == 0))
    {
      puVar1 = (undefined1 *)in_RDX[1].ack_queue.capacity;
      in_RDX[1].ack_queue.capacity = (size_t)(puVar1 + 1);
      *puVar1 = 1;
      in_RDI[0x10].datagrams = *(iovec **)&in_RDI[0x16].target.field_0x10;
      in_RDI[8].target.cipher =
           (st_quicly_cipher_context_t *)((long)&(in_RDI[8].target.cipher)->aead + 1);
    }
  }
  return iVar3;
}

Assistant:

static int send_handshake_flow(quicly_conn_t *conn, size_t epoch, quicly_send_context_t *s, int ack_only, int send_probe)
{
    struct st_quicly_pn_space_t *space;
    int ret = 0;

    /* setup send epoch, or return if it's impossible to send in this epoch */
    if ((space = setup_send_space(conn, epoch, s)) == NULL)
        return 0;

    /* send ACK */
    if (space != NULL && (space->unacked_count != 0 || send_probe))
        if ((ret = send_ack(conn, space, s)) != 0)
            goto Exit;

    if (!ack_only) {
        /* send data */
        while ((conn->egress.pending_flows & (uint8_t)(1 << epoch)) != 0) {
            quicly_stream_t *stream = quicly_get_stream(conn, -(quicly_stream_id_t)(1 + epoch));
            assert(stream != NULL);
            if ((ret = quicly_send_stream(stream, s)) != 0)
                goto Exit;
            resched_stream_data(stream);
            send_probe = 0;
        }

        /* send probe if requested */
        if (send_probe) {
            if ((ret = _do_allocate_frame(conn, s, 1, 1)) != 0)
                goto Exit;
            *s->dst++ = QUICLY_FRAME_TYPE_PING;
            conn->egress.last_retransmittable_sent_at = conn->stash.now;
            ++conn->super.stats.num_frames_sent.ping;
            QUICLY_PROBE(PING_SEND, conn, conn->stash.now);
        }
    }

Exit:
    return ret;
}